

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bucketaccum.h
# Opt level: O2

EExpr * __thiscall
mp::BucketAccumulator<mp::EExpr>::ExtractSum
          (EExpr *__return_storage_ptr__,BucketAccumulator<mp::EExpr> *this)

{
  LinTerms LStack_1c8;
  QuadTerms local_150;
  
  BucketAccum1Type<mp::LinTerms>::ExtractSum(&LStack_1c8,&this->ba_l_);
  BucketAccum1Type<mp::QuadTerms>::ExtractSum(&local_150,&this->ba_q_);
  EExpr::EExpr(__return_storage_ptr__,&LStack_1c8,&local_150,this->ct_);
  QuadTerms::~QuadTerms(&local_150);
  LinTerms::~LinTerms(&LStack_1c8);
  return __return_storage_ptr__;
}

Assistant:

EExprLike ExtractSum() {
    return EExprLike
        {ba_l_.ExtractSum(), ba_q_.ExtractSum(), ct_};
  }